

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

void mbedtls_ssl_config_free(mbedtls_ssl_config *conf)

{
  mbedtls_ssl_key_cert *pmVar1;
  mbedtls_ssl_key_cert *__ptr;
  
  mbedtls_mpi_free(&conf->dhm_P);
  mbedtls_mpi_free(&conf->dhm_G);
  if (conf->psk != (uchar *)0x0) {
    mbedtls_zeroize(conf->psk,conf->psk_len);
    mbedtls_zeroize(conf->psk_identity,conf->psk_identity_len);
    free(conf->psk);
    free(conf->psk_identity);
    conf->psk_len = 0;
    conf->psk_identity_len = 0;
  }
  __ptr = conf->key_cert;
  while (__ptr != (mbedtls_ssl_key_cert *)0x0) {
    pmVar1 = __ptr->next;
    free(__ptr);
    __ptr = pmVar1;
  }
  mbedtls_zeroize(conf,0x168);
  return;
}

Assistant:

void mbedtls_ssl_config_free( mbedtls_ssl_config *conf )
{
#if defined(MBEDTLS_DHM_C)
    mbedtls_mpi_free( &conf->dhm_P );
    mbedtls_mpi_free( &conf->dhm_G );
#endif

#if defined(MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED)
    if( conf->psk != NULL )
    {
        mbedtls_zeroize( conf->psk, conf->psk_len );
        mbedtls_zeroize( conf->psk_identity, conf->psk_identity_len );
        mbedtls_free( conf->psk );
        mbedtls_free( conf->psk_identity );
        conf->psk_len = 0;
        conf->psk_identity_len = 0;
    }
#endif

#if defined(MBEDTLS_X509_CRT_PARSE_C)
    ssl_key_cert_free( conf->key_cert );
#endif

    mbedtls_zeroize( conf, sizeof( mbedtls_ssl_config ) );
}